

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_aggregate_function.cpp
# Opt level: O3

void duckdb::SortedAggregateFunction::ProjectInputs
               (Vector *inputs,SortedAggregateBindData *order_bind,idx_t input_count,idx_t count,
               DataChunk *arg_input,DataChunk *sort_input)

{
  Vector *pVVar1;
  pointer pVVar2;
  Vector *dst;
  Vector *dst_1;
  pointer this;
  long lVar3;
  Vector *pVVar4;
  vector<duckdb::Vector,_true> *__range2;
  Vector *other;
  
  if (order_bind->sorted_on_args == false) {
    DataChunk::InitializeEmpty(arg_input,&order_bind->arg_types);
    pVVar1 = (arg_input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar3 = 0;
    other = inputs;
    for (pVVar4 = (arg_input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start; pVVar4 != pVVar1; pVVar4 = pVVar4 + 1) {
      lVar3 = lVar3 + 1;
      Vector::Reference(pVVar4,other);
      other = other + 1;
    }
    arg_input->count = count;
  }
  else {
    lVar3 = 0;
  }
  DataChunk::InitializeEmpty(sort_input,&order_bind->sort_types);
  this = (sort_input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
         super__Vector_impl_data._M_start;
  pVVar2 = (sort_input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (this != pVVar2) {
    pVVar4 = inputs + lVar3;
    do {
      Vector::Reference(this,pVVar4);
      this = this + 1;
      pVVar4 = pVVar4 + 1;
    } while (this != pVVar2);
  }
  sort_input->count = count;
  return;
}

Assistant:

static void ProjectInputs(Vector inputs[], const SortedAggregateBindData &order_bind, idx_t input_count,
	                          idx_t count, DataChunk &arg_input, DataChunk &sort_input) {
		idx_t col = 0;

		if (!order_bind.sorted_on_args) {
			arg_input.InitializeEmpty(order_bind.arg_types);
			for (auto &dst : arg_input.data) {
				dst.Reference(inputs[col++]);
			}
			arg_input.SetCardinality(count);
		}

		sort_input.InitializeEmpty(order_bind.sort_types);
		for (auto &dst : sort_input.data) {
			dst.Reference(inputs[col++]);
		}
		sort_input.SetCardinality(count);
	}